

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::Binary_Operator_AST_Node::do_oper
          (Binary_Operator_AST_Node *this,Dispatch_State *t_ss,Opers t_oper,string *t_oper_string,
          Boxed_Value *t_lhs,Boxed_Value *t_rhs)

{
  Dispatch_Engine *t_name;
  undefined4 in_register_00000014;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long lVar2;
  Boxed_Value BVar3;
  initializer_list<chaiscript::Boxed_Value> t_params;
  initializer_list<chaiscript::Boxed_Value> __l;
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *in_stack_00000008;
  allocator_type local_89;
  Boxed_Value *local_88;
  Dispatch_State *local_80;
  Function_Push_Pop fpp;
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> local_60;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_80 = (Dispatch_State *)CONCAT44(in_register_00000014,t_oper);
  if ((((Opers)t_oper_string == invalid) ||
      (((((t_rhs->m_data).
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        m_type_info).m_flags & 0x10) == 0)) ||
     (((in_stack_00000008->_M_ptr->m_type_info).m_flags & 0x10) == 0)) {
    local_88 = t_lhs;
    detail::Function_Push_Pop::Function_Push_Pop(&fpp,local_80);
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_70,
               (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)t_rhs);
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,in_stack_00000008);
    t_params._M_len = 2;
    t_params._M_array = (iterator)&local_70;
    detail::Function_Push_Pop::save_params(&fpp,t_params);
    lVar2 = 0x18;
    do {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_70._M_ptr + lVar2));
      lVar2 = lVar2 + -0x10;
    } while (lVar2 != -8);
    t_name = (local_80->m_engine)._M_data;
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_70,
               (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)t_rhs);
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,in_stack_00000008);
    __l._M_len = 2;
    __l._M_array = (iterator)&local_70;
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
              (&local_50,__l,&local_89);
    chaiscript::detail::Dispatch_Engine::call_function
              ((Dispatch_Engine *)this,(string *)t_name,(atomic_uint_fast32_t *)local_88,
               (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
               &t_ss[4].m_conversions,(Type_Conversions_State *)&local_50);
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
              (&local_50);
    lVar2 = 0x18;
    do {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_70._M_ptr + lVar2));
      lVar2 = lVar2 + -0x10;
    } while (lVar2 != -8);
    detail::Function_Push_Pop::~Function_Push_Pop(&fpp);
    _Var1._M_pi = extraout_RDX;
  }
  else {
    BVar3 = Boxed_Number::oper((Boxed_Number *)this,(Opers)t_oper_string,t_rhs,
                               (Boxed_Value *)in_stack_00000008);
    _Var1._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value do_oper(const chaiscript::detail::Dispatch_State &t_ss, 
            Operators::Opers t_oper, const std::string &t_oper_string, const Boxed_Value &t_lhs, const Boxed_Value &t_rhs) const
        {
          try {
            if (t_oper != Operators::invalid && t_lhs.get_type_info().is_arithmetic() && t_rhs.get_type_info().is_arithmetic())
            {
              // If it's an arithmetic operation we want to short circuit dispatch
              try{
                return Boxed_Number::do_oper(t_oper, t_lhs, t_rhs);
              } catch (const chaiscript::exception::arithmetic_error &) {
                throw;
              } catch (...) {
                throw exception::eval_error("Error with numeric operator calling: " + t_oper_string);
              }
            } else {
              chaiscript::eval::detail::Function_Push_Pop fpp(t_ss);
              fpp.save_params({t_lhs, t_rhs});
              return t_ss->call_function(t_oper_string, m_loc, {t_lhs, t_rhs}, t_ss.conversions());
            }
          }
          catch(const exception::dispatch_error &e){
            throw exception::eval_error("Can not find appropriate '" + t_oper_string + "' operator.", e.parameters, e.functions, false, *t_ss);
          }
        }